

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O2

void __thiscall mini_bus::NotifyToken<int>::notify(NotifyToken<int> *this,int *rhs)

{
  std::mutex::lock(&this->mtx);
  (this->value).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload._M_value = *rhs;
  (this->value).super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_engaged = true;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  std::condition_variable::notify_one();
  return;
}

Assistant:

inline void notify(T &&rhs) override {
    {
      std::lock_guard lock{mtx};
      value.emplace(std::move(rhs));
    }
    cv.notify_one();
  }